

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void ClipperLib::OpenPathsFromPolyTree(PolyTree *polytree,Paths *paths)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(paths,0);
  iVar1 = (int)((ulong)(*(long *)(polytree + 0x58) - (long)*(long **)(polytree + 0x50)) >> 3);
  if (0 < iVar1) {
    iVar1 = iVar1 - (uint)(**(long **)(polytree + 0x20) != **(long **)(polytree + 0x50));
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(paths,(long)iVar1);
  lVar2 = *(long *)(polytree + 0x20);
  if (0 < (int)((ulong)(*(long *)(polytree + 0x28) - lVar2) >> 3)) {
    lVar3 = 0;
    do {
      lVar2 = *(long *)(lVar2 + lVar3 * 8);
      if (*(char *)(lVar2 + 0x44) == '\x01') {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(paths,(value_type *)(lVar2 + 8));
      }
      lVar3 = lVar3 + 1;
      lVar2 = *(long *)(polytree + 0x20);
    } while (lVar3 < (int)((ulong)(*(long *)(polytree + 0x28) - lVar2) >> 3));
  }
  return;
}

Assistant:

void OpenPathsFromPolyTree(PolyTree& polytree, Paths& paths)
{
  paths.resize(0); 
  paths.reserve(polytree.Total());
  //Open paths are top level only, so ...
  for (int i = 0; i < polytree.ChildCount(); ++i)
    if (polytree.Childs[i]->IsOpen())
      paths.push_back(polytree.Childs[i]->Contour);
}